

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O1

PyObject * __thiscall
boost::python::detail::caller_arity<2U>::
impl<int_(MlmWrap::*)(HighFreqDataType),_boost::python::default_call_policies,_boost::mpl::vector3<int,_AbstractModuleClient_&,_HighFreqDataType>_>
::operator()(impl<int_(MlmWrap::*)(HighFreqDataType),_boost::python::default_call_policies,_boost::mpl::vector3<int,_AbstractModuleClient_&,_HighFreqDataType>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  int iVar2;
  long lVar3;
  PyObject *pPVar4;
  long *plVar5;
  code *pcVar6;
  c_t1 c1;
  undefined1 local_168 [16];
  HighFreqDataType local_158;
  _object *local_c8;
  HighFreqDataType local_b0;
  
  lVar3 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<AbstractModuleClient_const_volatile&>::
                     converters);
  if (lVar3 == 0) {
    pPVar4 = (PyObject *)0x0;
  }
  else {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    local_168 = converter::rvalue_from_python_stage1
                          (p_Var1,converter::detail::
                                  registered_base<HighFreqDataType_const_volatile&>::converters);
    local_c8 = p_Var1;
    if (local_168._0_8_ == 0) {
      pPVar4 = (PyObject *)0x0;
    }
    else {
      pcVar6 = (code *)(this->m_data).
                       super_compressed_pair_imp<int_(MlmWrap::*)(HighFreqDataType),_boost::python::default_call_policies,_2>
                       .first_;
      plVar5 = (long *)(lVar3 + *(long *)&(this->m_data).
                                          super_compressed_pair_imp<int_(MlmWrap::*)(HighFreqDataType),_boost::python::default_call_policies,_2>
                                          .field_0x8);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *plVar5 + -1);
      }
      if (local_168._8_8_ != (code *)0x0) {
        (*local_168._8_8_)(p_Var1,local_168);
      }
      HighFreqDataType::HighFreqDataType(&local_b0,(HighFreqDataType *)local_168._0_8_);
      iVar2 = (*pcVar6)(plVar5,&local_b0);
      pPVar4 = (PyObject *)PyLong_FromLong((long)iVar2);
      HighFreqDataType::~HighFreqDataType(&local_b0);
    }
    if ((HighFreqDataType *)local_168._0_8_ == &local_158) {
      (**local_158.super_NetworkDataType._vptr_NetworkDataType)();
    }
  }
  return pPVar4;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }